

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O1

aiReturn __thiscall Assimp::ZipFile::Seek(ZipFile *this,size_t pOffset,aiOrigin pOrigin)

{
  if (pOrigin == aiOrigin_END) {
    if (this->m_Size < pOffset) {
      return aiReturn_FAILURE;
    }
    this->m_SeekPtr = this->m_Size - pOffset;
  }
  else {
    if (pOrigin == aiOrigin_CUR) {
      pOffset = pOffset + this->m_SeekPtr;
      if (this->m_Size < pOffset) {
        return aiReturn_FAILURE;
      }
    }
    else if ((pOrigin != aiOrigin_SET) || (this->m_Size < pOffset)) {
      return aiReturn_FAILURE;
    }
    this->m_SeekPtr = pOffset;
  }
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn ZipFile::Seek(size_t pOffset, aiOrigin pOrigin) {
        switch (pOrigin)
        {
        case aiOrigin_SET: {
            if (pOffset > m_Size) return aiReturn_FAILURE;
            m_SeekPtr = pOffset;
            return aiReturn_SUCCESS;
        }

        case aiOrigin_CUR: {
            if ((pOffset + m_SeekPtr) > m_Size) return aiReturn_FAILURE;
            m_SeekPtr += pOffset;
            return aiReturn_SUCCESS;
        }

        case aiOrigin_END: {
            if (pOffset > m_Size) return aiReturn_FAILURE;
            m_SeekPtr = m_Size - pOffset;
            return aiReturn_SUCCESS;
        }
        default:;
        }

        return aiReturn_FAILURE;
    }